

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O2

string * ReplaceOrigin(string *__return_storage_ptr__,string *rpath,string *origin)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> end;
  string_view pathv;
  RegularExpressionMatch match;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originRegex == '\0')
     && (iVar2 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                      ::originRegex), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ReplaceOrigin::originRegex,"(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originRegex);
  }
  if ((ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::originCurlyRegex ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                   ::originCurlyRegex), iVar2 != 0)) {
    cmsys::RegularExpression::RegularExpression(&ReplaceOrigin::originCurlyRegex,"\\${ORIGIN}");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ReplaceOrigin::originCurlyRegex,
                 &__dso_handle);
    __cxa_guard_release(&ReplaceOrigin(std::__cxx11::string_const&,std::__cxx11::string_const&)::
                         originCurlyRegex);
  }
  memset(&match,0,0xa8);
  bVar1 = cmsys::RegularExpression::find
                    (&ReplaceOrigin::originRegex,(rpath->_M_dataplus)._M_p,&match);
  if (bVar1) {
    pathv._M_str = (rpath->_M_dataplus)._M_p;
    pathv._M_len = rpath->_M_string_length;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&pathv,0,(long)match.startp[1] - (long)match.searchstring);
  }
  else {
    bVar1 = cmsys::RegularExpression::find
                      (&ReplaceOrigin::originCurlyRegex,(rpath->_M_dataplus)._M_p,&match);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)rpath);
      return __return_storage_ptr__;
    }
    pathv._M_str = (rpath->_M_dataplus)._M_p;
    pathv._M_len = rpath->_M_string_length;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&pathv,0,(long)match.startp[0] - (long)match.searchstring);
    match.endp[1] = match.endp[0];
  }
  end = std::basic_string_view<char,_std::char_traits<char>_>::substr
                  (&pathv,(long)match.endp[1] - (long)match.searchstring,0xffffffffffffffff);
  local_88.View_._M_str = (origin->_M_dataplus)._M_p;
  local_88.View_._M_len = origin->_M_string_length;
  local_58.View_ = bVar3;
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
            (__return_storage_ptr__,&local_58,&local_88,&end);
  return __return_storage_ptr__;
}

Assistant:

static std::string ReplaceOrigin(const std::string& rpath,
                                 const std::string& origin)
{
  static const cmsys::RegularExpression originRegex(
    "(\\$ORIGIN)([^a-zA-Z0-9_]|$)");
  static const cmsys::RegularExpression originCurlyRegex("\\${ORIGIN}");

  cmsys::RegularExpressionMatch match;
  if (originRegex.find(rpath.c_str(), match)) {
    cm::string_view pathv(rpath);
    auto begin = pathv.substr(0, match.start(1));
    auto end = pathv.substr(match.end(1));
    return cmStrCat(begin, origin, end);
  }
  if (originCurlyRegex.find(rpath.c_str(), match)) {
    cm::string_view pathv(rpath);
    auto begin = pathv.substr(0, match.start());
    auto end = pathv.substr(match.end());
    return cmStrCat(begin, origin, end);
  }
  return rpath;
}